

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Light_Button.cxx
# Opt level: O3

void __thiscall Fl_Light_Button::draw(Fl_Light_Button *this)

{
  byte bVar1;
  int iVar2;
  Fl_Color FVar3;
  int iVar4;
  _func_int **pp_Var5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint H;
  ulong uVar9;
  Fl_Boxtype t;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  bVar1 = (this->super_Fl_Button).super_Fl_Widget.box_;
  if (bVar1 != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((bVar1 != 1 && Fl::pushed_ == (Fl_Widget *)this) | bVar1),
                        (this->super_Fl_Button).super_Fl_Widget.color_);
  }
  if ((this->super_Fl_Button).value_ == '\0') {
    FVar3 = (this->super_Fl_Button).super_Fl_Widget.color_;
  }
  else {
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar3 = (this->super_Fl_Button).super_Fl_Widget.color2_;
    if (iVar2 == 0) {
      FVar3 = fl_inactive(FVar3);
    }
  }
  H = (this->super_Fl_Button).super_Fl_Widget.label_.size;
  iVar4 = Fl::box_dx((uint)(this->super_Fl_Button).super_Fl_Widget.box_);
  iVar13 = iVar4 + 2;
  iVar2 = (this->super_Fl_Button).super_Fl_Widget.h_;
  iVar14 = (int)(iVar2 - H) / 2;
  bVar1 = (this->super_Fl_Button).down_box_;
  t = (Fl_Boxtype)bVar1;
  if (0x1f < bVar1) {
LAB_001bd202:
    iVar13 = iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_;
    iVar14 = iVar14 + (this->super_Fl_Button).super_Fl_Widget.y_;
    uVar8 = H;
LAB_001bd222:
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar13,iVar14,uVar8,H,FVar3);
    H = uVar8;
    goto LAB_001bd227;
  }
  if ((0xc000000cU >> (bVar1 & 0x1f) & 1) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_,
                        (this->super_Fl_Button).super_Fl_Widget.y_ + iVar14,H,H,7);
    if ((this->super_Fl_Button).value_ != '\0') {
      if ((Fl::scheme_ != (char *)0x0) && (iVar2 = strcmp("gtk+",Fl::scheme_), iVar2 == 0)) {
        FVar3 = 0xf;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar3);
      iVar2 = (this->super_Fl_Button).super_Fl_Widget.x_;
      uVar11 = iVar4 + iVar2 + 5;
      iVar13 = (int)(H - 6) / 3;
      iVar6 = (int)(((H - 6) - iVar13) + H) / 2;
      uVar8 = uVar11 + iVar13;
      iVar14 = iVar14 + (this->super_Fl_Button).super_Fl_Widget.y_;
      uVar16 = ((iVar13 + iVar14 + iVar6) - H) + 5;
      uVar15 = (iVar14 + iVar6) - 2;
      iVar14 = 3;
      do {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)uVar11,(ulong)(uVar15 - iVar13),(ulong)uVar8,
                   (ulong)uVar15);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)uVar8,(ulong)uVar15,(ulong)((iVar4 + iVar2 + H) - 2),
                   (ulong)uVar16);
        uVar16 = uVar16 + 1;
        uVar15 = uVar15 + 1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    goto LAB_001bd227;
  }
  if ((0xc00000U >> (t & _FL_PLASTIC_DOWN_BOX) & 1) == 0) {
    if (t != FL_NO_BOX) goto LAB_001bd202;
    iVar6 = (this->super_Fl_Button).super_Fl_Widget.w_;
    uVar8 = (int)H / 2 + 1;
    if (iVar6 < (int)H / 2 + iVar13 * 2 + 1) {
      iVar13 = (int)(iVar6 - uVar8) / 2;
    }
    H = (iVar2 + iVar14 * -2) - 2;
    if ((Fl::scheme_ != (char *)0x0) && (iVar2 = strcmp("plastic",Fl::scheme_), iVar2 == 0)) {
      iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
      FVar3 = (this->super_Fl_Button).super_Fl_Widget.color2_;
      if (iVar2 == 0) {
        FVar3 = fl_inactive(FVar3);
      }
      if ((this->super_Fl_Button).value_ == '\0') {
        FVar3 = fl_color_average(FVar3,0x38,0.5);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar3);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0,0x4076800000000000,fl_graphics_driver,
                 (ulong)(uint)(iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_),
                 (ulong)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar14 + 1),(ulong)uVar8,
                 (ulong)H);
      H = uVar8;
      goto LAB_001bd227;
    }
    iVar13 = iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_;
    iVar14 = (this->super_Fl_Button).super_Fl_Widget.y_ + iVar14 + 1;
    t = FL_THIN_DOWN_BOX;
    goto LAB_001bd222;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,t,(this->super_Fl_Button).super_Fl_Widget.x_ + iVar13,
                      (this->super_Fl_Button).super_Fl_Widget.y_ + iVar14,H,H,7);
  if ((this->super_Fl_Button).value_ == '\0') goto LAB_001bd227;
  iVar2 = Fl::box_dw((uint)(this->super_Fl_Button).down_box_);
  iVar2 = (int)(H - iVar2) / 2;
  uVar8 = iVar2 + 1;
  uVar11 = iVar2 + 2;
  if ((H - uVar8 & 1) == 0) {
    uVar11 = uVar8;
  }
  uVar9 = (ulong)uVar11;
  iVar2 = (int)(H - uVar11) / 2;
  iVar13 = iVar13 + iVar2;
  iVar2 = iVar2 + iVar14;
  if ((Fl::scheme_ != (char *)0x0) && (iVar14 = strcmp("gtk+",Fl::scheme_), iVar14 == 0)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0xf);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4076800000000000,fl_graphics_driver,
               (ulong)((iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_) - 1),
               (ulong)((iVar2 + (this->super_Fl_Button).super_Fl_Widget.y_) - 1),(ulong)(uVar11 + 2)
               ,(ulong)(uVar11 + 2));
    FVar3 = fl_color_average(0xff,0xf,0.2);
    uVar9 = (ulong)(uVar11 - 1);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
  iVar14 = (int)uVar9;
  if (iVar14 - 3U < 3) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_ + 1),
               (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar2),
               (ulong)(iVar14 - 2U),uVar9);
    uVar10 = (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar13);
    uVar7 = (ulong)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar2 + 1);
    pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    uVar12 = (ulong)(iVar14 - 2U);
LAB_001bd361:
    (*pp_Var5[4])(fl_graphics_driver,uVar10,uVar7,uVar9,uVar12);
  }
  else {
    if (iVar14 - 1U < 2) {
      uVar10 = (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar13);
      uVar7 = (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar2);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar12 = uVar9;
      goto LAB_001bd361;
    }
    if (iVar14 == 6) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_ + 2)
                 ,(ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar2),2,6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_ + 1)
                 ,(ulong)(uint)(iVar2 + 1 + (this->super_Fl_Button).super_Fl_Widget.y_),4,4);
      uVar10 = (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar13);
      uVar7 = (ulong)(iVar2 + (this->super_Fl_Button).super_Fl_Widget.y_ + 2);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar9 = 6;
      uVar12 = 2;
      goto LAB_001bd361;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4076800000000000,fl_graphics_driver,
               (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar13),
               (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar2),uVar9,uVar9);
  }
  if ((Fl::scheme_ != (char *)0x0) && (iVar6 = strcmp("gtk+",Fl::scheme_), iVar6 == 0)) {
    FVar3 = fl_color_average(0xff,0xf,0.5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x404e000000000000,0x4066800000000000,fl_graphics_driver,
               (ulong)(uint)(iVar13 + (this->super_Fl_Button).super_Fl_Widget.x_),
               (ulong)(uint)(iVar2 + (this->super_Fl_Button).super_Fl_Widget.y_),
               (ulong)(iVar14 + 1U),(ulong)(iVar14 + 1U));
  }
LAB_001bd227:
  Fl_Widget::draw_label
            ((Fl_Widget *)this,iVar4 + H + 4 + (this->super_Fl_Button).super_Fl_Widget.x_,
             (this->super_Fl_Button).super_Fl_Widget.y_,
             (this->super_Fl_Button).super_Fl_Widget.w_ - (iVar4 * 2 + H + 4),
             (this->super_Fl_Button).super_Fl_Widget.h_);
  if (Fl::focus_ == (Fl_Widget *)this) {
    Fl_Widget::draw_focus
              ((Fl_Widget *)this,(uint)(this->super_Fl_Button).super_Fl_Widget.box_,
               (this->super_Fl_Button).super_Fl_Widget.x_,(this->super_Fl_Button).super_Fl_Widget.y_
               ,(this->super_Fl_Button).super_Fl_Widget.w_,
               (this->super_Fl_Button).super_Fl_Widget.h_);
    return;
  }
  return;
}

Assistant:

void Fl_Light_Button::draw() {
  if (box()) draw_box(this==Fl::pushed() ? fl_down(box()) : box(), color());
  Fl_Color col = value() ? (active_r() ? selection_color() :
                            fl_inactive(selection_color())) : color();

  int W  = labelsize();
  int bx = Fl::box_dx(box());	// box frame width
  int dx = bx + 2;		// relative position of check mark etc.
  int dy = (h() - W) / 2;	// neg. offset o.k. for vertical centering
  int lx = 0;			// relative label position (STR #3237)

  if (down_box()) {
    // draw other down_box() styles:
    switch (down_box()) {
      case FL_DOWN_BOX :
      case FL_UP_BOX :
      case _FL_PLASTIC_DOWN_BOX :
      case _FL_PLASTIC_UP_BOX :
        // Check box...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	  } else {
	    fl_color(col);
	  }
	  int tx = x() + dx + 3;
	  int tw = W - 6;
	  int d1 = tw/3;
	  int d2 = tw-d1;
	  int ty = y() + dy + (W+d2)/2-d1-2;
	  for (int n = 0; n < 3; n++, ty++) {
	    fl_line(tx, ty, tx+d1, ty+d1);
	    fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	  }
	}
        break;
      case _FL_ROUND_DOWN_BOX :
      case _FL_ROUND_UP_BOX :
        // Radio button...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  int tW = (W - Fl::box_dw(down_box())) / 2 + 1;
	  if ((W - tW) & 1) tW++; // Make sure difference is even to center
	  int tdx = dx + (W - tW) / 2;
	  int tdy = dy + (W - tW) / 2;

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	    tW --;
	    fl_pie(x() + tdx - 1, y() + tdy - 1, tW + 3, tW + 3, 0.0, 360.0);
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	  } else fl_color(col);

	  switch (tW) {
	    // Larger circles draw fine...
	    default :
              fl_pie(x() + tdx, y() + tdy, tW, tW, 0.0, 360.0);
	      break;

            // Small circles don't draw well on many systems...
	    case 6 :
	      fl_rectf(x() + tdx + 2, y() + tdy, tW - 4, tW);
	      fl_rectf(x() + tdx + 1, y() + tdy + 1, tW - 2, tW - 2);
	      fl_rectf(x() + tdx, y() + tdy + 2, tW, tW - 4);
	      break;

	    case 5 :
	    case 4 :
	    case 3 :
	      fl_rectf(x() + tdx + 1, y() + tdy, tW - 2, tW);
	      fl_rectf(x() + tdx, y() + tdy + 1, tW, tW - 2);
	      break;

	    case 2 :
	    case 1 :
	      fl_rectf(x() + tdx, y() + tdy, tW, tW);
	      break;
	  }

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	    fl_arc(x() + tdx, y() + tdy, tW + 1, tW + 1, 60.0, 180.0);
	  }
	}
        break;
      default :
        draw_box(down_box(), x()+dx, y()+dy, W, W, col);
        break;
    }
    lx = dx + W + 2;
  } else {
    // if down_box() is zero, draw light button style:
    int hh = h()-2*dy - 2;
    int ww = W/2+1;
    int xx = dx;
    if (w()<ww+2*xx) xx = (w()-ww)/2;
    if (Fl::is_scheme("plastic")) {
      col = active_r() ? selection_color() : fl_inactive(selection_color());
      fl_color(value() ? col : fl_color_average(col, FL_BLACK, 0.5f));
      fl_pie(x()+xx, y()+dy+1, ww, hh, 0, 360);
    } else {
      draw_box(FL_THIN_DOWN_BOX, x()+xx, y()+dy+1, ww, hh, col);
    }
    lx = dx + ww + 2;
  }
  draw_label(x()+lx, y(), w()-lx-bx, h());
  if (Fl::focus() == this) draw_focus();
}